

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O0

bool __thiscall Clasp::Asp::SccChecker::recurse(SccChecker *this,Call *c)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  PrgNode *pPVar4;
  head_iterator pPVar5;
  dep_iterator pLVar6;
  PrgBody *pPVar7;
  atom_iterator pVVar8;
  PrgAtom *pPVar9;
  ulong uVar10;
  LogicProgram *siglen;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *extraout_RDX_02;
  uchar *sig;
  LogicProgram *in_RSI;
  PrgBody *c_00;
  long in_RDI;
  uchar *in_R8;
  size_t in_R9;
  PrgAtom *a_1;
  atom_iterator end_2;
  atom_iterator it_2;
  PrgDisj *d;
  PrgBody *bn;
  dep_iterator end_1;
  dep_iterator it_1;
  PrgAtom *a;
  head_iterator end;
  head_iterator it;
  NodeType t;
  PrgHead *h;
  PrgBody *b;
  PrgNode *n;
  PrgAtom *in_stack_ffffffffffffff08;
  LogicProgram *in_stack_ffffffffffffff10;
  unsigned_long *in_stack_ffffffffffffff18;
  atom_iterator pVVar11;
  Call *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  PrgNode *in_stack_ffffffffffffff30;
  PrgNode *n_00;
  SccChecker *in_stack_ffffffffffffff38;
  SccChecker *this_00;
  atom_iterator local_78;
  PrgNode *local_58;
  PrgEdge *local_40;
  
  pPVar4 = unpackNode((uintp)(in_RSI->super_ProgramBuilder)._vptr_ProgramBuilder);
  bVar2 = PrgNode::seen(pPVar4);
  if (!bVar2) {
    bk_lib::pod_vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((pod_vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    iVar1 = *(int *)(in_RDI + 0x30);
    *(int *)(in_RDI + 0x30) = iVar1 + 1;
    *(int *)&(in_RSI->super_ProgramBuilder).ctx_ = iVar1;
    PrgNode::resetId(pPVar4,*(uint32 *)&(in_RSI->super_ProgramBuilder).ctx_,true);
  }
  bVar2 = isNode((uintp)(in_RSI->super_ProgramBuilder)._vptr_ProgramBuilder,Body);
  if (bVar2) {
    local_40 = PrgBody::heads_begin((PrgBody *)in_stack_ffffffffffffff10);
    uVar3 = *(uint *)((long)&(in_RSI->super_ProgramBuilder).ctx_ + 4);
    pPVar5 = PrgBody::heads_end((PrgBody *)in_stack_ffffffffffffff10);
    for (local_40 = local_40 + uVar3; local_40 != pPVar5; local_40 = local_40 + 1) {
      bVar2 = PrgEdge::isAtom((PrgEdge *)0x19f0c4);
      if (bVar2) {
        PrgEdge::node(local_40);
        LogicProgram::getAtom
                  (in_stack_ffffffffffffff10,(Id_t)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      }
      else {
        PrgEdge::node(local_40);
        LogicProgram::getDisj
                  (in_stack_ffffffffffffff10,(Id_t)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      }
      bVar2 = doVisit((SccChecker *)in_stack_ffffffffffffff10,(PrgNode *)in_stack_ffffffffffffff08,
                      false);
      if (bVar2) {
        PrgBody::heads_begin((PrgBody *)in_stack_ffffffffffffff10);
        bVar2 = onNode(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                       (NodeType)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                       in_stack_ffffffffffffff20,(uint32)((ulong)in_stack_ffffffffffffff18 >> 0x20))
        ;
        if (bVar2) {
          return true;
        }
      }
    }
  }
  else {
    c_00 = (PrgBody *)0x0;
    bVar2 = isNode((uintp)(in_RSI->super_ProgramBuilder)._vptr_ProgramBuilder,Atom);
    if (bVar2) {
      pLVar6 = PrgAtom::deps_begin((PrgAtom *)0x19f22e);
      uVar10 = (ulong)*(uint *)((long)&(in_RSI->super_ProgramBuilder).ctx_ + 4);
      siglen = (LogicProgram *)(uVar10 * 4);
      pPVar4 = (PrgNode *)PrgAtom::deps_end((PrgAtom *)0x19f255);
      sig = extraout_RDX;
      for (local_58 = (PrgNode *)(pLVar6 + uVar10); local_58 != pPVar4;
          local_58 = (PrgNode *)&local_58->field_0x4) {
        uVar3 = Literal::sign((Literal *)local_58,(EVP_PKEY_CTX *)c_00,sig,(size_t *)siglen,in_R8,
                              in_R9);
        sig = extraout_RDX_00;
        if ((uVar3 & 1) == 0) {
          this_00 = *(SccChecker **)(in_RDI + 0x20);
          Literal::var((Literal *)local_58);
          pPVar7 = LogicProgram::getBody
                             (in_stack_ffffffffffffff10,
                              (Id_t)((ulong)in_stack_ffffffffffffff08 >> 0x20));
          c_00 = pPVar7;
          bVar2 = doVisit((SccChecker *)in_stack_ffffffffffffff10,
                          (PrgNode *)in_stack_ffffffffffffff08,false);
          sig = extraout_RDX_01;
          if (bVar2) {
            c_00 = pPVar7;
            siglen = in_RSI;
            n_00 = local_58;
            pLVar6 = PrgAtom::deps_begin((PrgAtom *)0x19f308);
            in_R8 = (uchar *)((long)n_00 - (long)pLVar6 >> 2 & 0xffffffff);
            bVar2 = onNode(this_00,n_00,(NodeType)((ulong)siglen >> 0x20),(Call *)c_00,
                           (uint32)((ulong)in_stack_ffffffffffffff18 >> 0x20));
            sig = extraout_RDX_02;
            if (bVar2) {
              return true;
            }
          }
        }
      }
    }
    else {
      bVar2 = isNode((uintp)(in_RSI->super_ProgramBuilder)._vptr_ProgramBuilder,Disj);
      if (bVar2) {
        local_78 = PrgDisj::begin((PrgDisj *)pPVar4);
        uVar3 = *(uint *)((long)&(in_RSI->super_ProgramBuilder).ctx_ + 4);
        pVVar8 = PrgDisj::end((PrgDisj *)in_stack_ffffffffffffff10);
        for (local_78 = local_78 + uVar3; local_78 != pVVar8; local_78 = local_78 + 1) {
          pPVar9 = LogicProgram::getAtom
                             (in_stack_ffffffffffffff10,
                              (Id_t)((ulong)in_stack_ffffffffffffff08 >> 0x20));
          bVar2 = doVisit((SccChecker *)in_stack_ffffffffffffff10,
                          (PrgNode *)in_stack_ffffffffffffff08,false);
          if (bVar2) {
            in_stack_ffffffffffffff10 = in_RSI;
            pVVar11 = local_78;
            PrgDisj::begin((PrgDisj *)pPVar4);
            bVar2 = onNode(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                           (NodeType)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                           in_stack_ffffffffffffff20,(uint32)((ulong)pVVar11 >> 0x20));
            in_stack_ffffffffffffff08 = pPVar9;
            if (bVar2) {
              return true;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool SccChecker::recurse(Call& c) {
	PrgNode* n = unpackNode(c.node);
	if (!n->seen()) {
		nodeStack_.push_back(c.node);
		c.min = count_++;
		n->resetId(c.min, true);
	}
	if (isNode(c.node, PrgNode::Body)) {
		PrgBody* b = static_cast<PrgBody*>(n);
		PrgHead* h = 0; NodeType t;
		for (PrgBody::head_iterator it = b->heads_begin() + c.next, end = b->heads_end(); it != end; ++it) {
			if   (it->isAtom()){ h = prg_->getAtom(it->node()); t = PrgNode::Atom; }
			else               { h = prg_->getDisj(it->node()); t = PrgNode::Disj; }
			if (doVisit(h, false) && onNode(h, t, c, static_cast<uint32>(it-b->heads_begin()))) {
				return true;
			}
		}
	}
	else if (isNode(c.node, PrgNode::Atom)) {
		PrgAtom* a = static_cast<PrgAtom*>(n);
		for (PrgAtom::dep_iterator it = a->deps_begin() + c.next, end = a->deps_end(); it != end; ++it) {
			if (it->sign()) continue;
			PrgBody* bn = prg_->getBody(it->var());
			if (doVisit(bn, false) && onNode(bn, PrgNode::Body, c, static_cast<uint32>(it-a->deps_begin()))) {
				return true;
			}
		}
	}
	else if (isNode(c.node, PrgNode::Disj)) {
		PrgDisj* d = static_cast<PrgDisj*>(n);
		for (PrgDisj::atom_iterator it = d->begin() + c.next, end = d->end(); it != end; ++it) {
			PrgAtom* a = prg_->getAtom(*it);
			if (doVisit(a, false) && onNode(a, PrgNode::Atom, c, static_cast<uint32>(it-d->begin()))) {
				return true;
			}
		}
	}
	return false;
}